

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

ByteData *
cfd::core::ConfidentialValue::ConvertToConfidentialValue
          (ByteData *__return_storage_ptr__,Amount *value)

{
  int iVar1;
  string *message;
  uchar *bytes_out;
  size_type len;
  undefined8 uVar2;
  allocator_type *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  CfdError error_code;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  allocator local_91;
  string local_90 [32];
  CfdSourceLocation local_70;
  int local_54;
  string *psStack_50;
  int ret;
  uint64_t satoshi;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  Amount *value_local;
  
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)value;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4cc354);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38
             ,in_stack_ffffffffffffff30);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4cc374);
  message = (string *)
            Amount::GetSatoshiValue
                      ((Amount *)
                       buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  psStack_50 = message;
  bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4cc3ac);
  len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  iVar1 = wally_tx_confidential_value_from_satoshi((uint64_t)message,bytes_out,len);
  error_code = (CfdError)((ulong)bytes_out >> 0x20);
  local_54 = iVar1;
  if (iVar1 != 0) {
    local_70.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_70.filename = local_70.filename + 1;
    local_70.line = 0x287;
    local_70.funcname = "ConvertToConfidentialValue";
    logger::warn<int&>(&local_70,"wally_tx_confidential_value_from_satoshi NG[{}].",&local_54);
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_90,"generate confidential value error.",&local_91);
    CfdException::CfdException
              ((CfdException *)CONCAT44(iVar1,in_stack_ffffffffffffff40),error_code,message);
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  return __return_storage_ptr__;
}

Assistant:

ByteData ConfidentialValue::ConvertToConfidentialValue(  // force LF
    const Amount &value) {
  std::vector<uint8_t> buffer(kConfidentialValueSize);
  uint64_t satoshi = static_cast<uint64_t>(value.GetSatoshiValue());
  int ret = wally_tx_confidential_value_from_satoshi(
      satoshi, buffer.data(), buffer.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_confidential_value_from_satoshi NG[{}].",
        ret);
    throw CfdException(
        kCfdIllegalStateError, "generate confidential value error.");
  }
  return ByteData(buffer);
}